

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O0

void __thiscall
VcdGen::TickData::append(TickData *this,tuple<unsigned_long,_unsigned_int> *data,Signal *signal)

{
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_int>_> *__args;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_int>_> *__args_1;
  undefined1 local_50 [16];
  _Head_base<0UL,_unsigned_long,_false> local_40;
  undefined1 local_38 [8];
  tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*> tmp;
  Signal *signal_local;
  tuple<unsigned_long,_unsigned_int> *data_local;
  TickData *this_local;
  
  tmp.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = (unsigned_long)signal;
  __args = std::get<0ul,unsigned_long,unsigned_int>(data);
  __args_1 = std::get<1ul,unsigned_long,unsigned_int>(data);
  std::make_tuple<unsigned_long&,unsigned_int&,VcdGen::Signal_const*&>
            ((tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*> *)local_38,__args,__args_1,
             (Signal **)
             &tmp.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>.
              super__Head_base<0UL,_unsigned_long,_false>);
  local_50._0_8_ = local_38;
  local_50._8_8_ =
       tmp.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>.
       super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>.
       super__Tuple_impl<2UL,_const_VcdGen::Signal_*>.
       super__Head_base<2UL,_const_VcdGen::Signal_*,_false>._M_head_impl;
  local_40._M_head_impl =
       tmp.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>.
       super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>._8_8_;
  append(this,(tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*> *)local_50);
  return;
}

Assistant:

void append(tuple<uint64_t, uint32_t> data, const Signal* signal){
        auto tmp = make_tuple(get<0>(data), get<1>(data), signal);
        this->append(tmp);
    }